

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

double aom_noise_strength_lut_eval(aom_noise_strength_lut_t *lut,double x)

{
  uint uVar1;
  double dVar2;
  double (*padVar3) [2];
  long lVar4;
  double dVar5;
  
  padVar3 = lut->points;
  if (x < (*padVar3)[0]) {
    return (*padVar3)[1];
  }
  uVar1 = lut->num_points - 1;
  if (1 < lut->num_points) {
    lVar4 = 0;
    do {
      dVar5 = *(double *)((long)*padVar3 + lVar4);
      if ((dVar5 <= x) && (dVar2 = *(double *)((long)padVar3[1] + lVar4), x <= dVar2)) {
        dVar5 = (x - dVar5) / (dVar2 - dVar5);
        return dVar5 * *(double *)((long)padVar3[1] + lVar4 + 8) +
               (1.0 - dVar5) * *(double *)((long)*padVar3 + lVar4 + 8);
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar4);
  }
  return padVar3[(int)uVar1][1];
}

Assistant:

double aom_noise_strength_lut_eval(const aom_noise_strength_lut_t *lut,
                                   double x) {
  int i = 0;
  // Constant extrapolation for x <  x_0.
  if (x < lut->points[0][0]) return lut->points[0][1];
  for (i = 0; i < lut->num_points - 1; ++i) {
    if (x >= lut->points[i][0] && x <= lut->points[i + 1][0]) {
      const double a =
          (x - lut->points[i][0]) / (lut->points[i + 1][0] - lut->points[i][0]);
      return lut->points[i + 1][1] * a + lut->points[i][1] * (1.0 - a);
    }
  }
  // Constant extrapolation for x > x_{n-1}
  return lut->points[lut->num_points - 1][1];
}